

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> __thiscall
duckdb::ClientContext::TableInfo(ClientContext *this,string *schema_name,string *table_name)

{
  allocator local_49;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_4b71df5 + 9,&local_49);
  TableInfo(this,schema_name,&local_48,table_name);
  ::std::__cxx11::string::~string((string *)&local_48);
  return (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
         (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)this;
}

Assistant:

unique_ptr<TableDescription> ClientContext::TableInfo(const string &schema_name, const string &table_name) {
	return TableInfo(INVALID_CATALOG, schema_name, table_name);
}